

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O0

int __thiscall JetHead::IReaderWriter::writeAll(IReaderWriter *this,void *buffer,int length)

{
  int iVar1;
  int local_28;
  int result;
  int bytesWritten;
  int length_local;
  void *buffer_local;
  IReaderWriter *this_local;
  
  local_28 = 0;
  while( true ) {
    if (length <= local_28) {
      return local_28;
    }
    iVar1 = (*this->_vptr_IReaderWriter[3])
                      (this,(long)buffer + (long)local_28,(ulong)(uint)(length - local_28));
    if (iVar1 < 0) break;
    local_28 = iVar1 + local_28;
  }
  return iVar1;
}

Assistant:

virtual int writeAll(const void *buffer, int length)
		{
			int bytesWritten = 0;
			
			while (bytesWritten < length)
			{
				int result = write((uint8_t*)buffer + bytesWritten,
								   length - bytesWritten);
				if (result < 0)
					return result;
	
				bytesWritten += result;
			}
			return bytesWritten;
		}